

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

void ddb(Integer ndims,Integer *ardims,Integer npes,Integer *blk,Integer *pedims)

{
  Integer *pIVar1;
  long lVar2;
  Integer *ardims_00;
  Integer *blk_00;
  Integer *pedims_00;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  size_t __nmemb;
  
  __nmemb = 0;
  lVar6 = ndims;
  while (0 < lVar6) {
    lVar5 = lVar6 + -1;
    lVar2 = blk[lVar6 + -1];
    if (lVar2 < 1) {
      pedims[lVar6 + -1] = -1;
      __nmemb = __nmemb + 1;
      lVar6 = lVar5;
    }
    else {
      lVar2 = (ardims[lVar6 + -1] + lVar2 + -1) / lVar2;
      if (npes < lVar2) {
        pedims[lVar6 + -1] = npes;
        lVar6 = lVar5;
        npes = 1;
      }
      else {
        for (; (lVar3 = npes, npes != lVar2 && (lVar3 = lVar2, npes % lVar2 != 0));
            lVar2 = lVar2 + 1) {
        }
        pedims[lVar6 + -1] = lVar3;
        npes = npes / lVar3;
        lVar6 = lVar5;
      }
    }
  }
  if (__nmemb == 0) {
    lVar6 = 0;
    if (ndims < 1) {
      ndims = lVar6;
    }
    for (; ndims != lVar6; lVar6 = lVar6 + 1) {
      if (pedims[lVar6] < 0) {
        pedims[lVar6] = 1;
      }
    }
  }
  else {
    ardims_00 = (Integer *)calloc(__nmemb,8);
    if (ardims_00 == (Integer *)0x0) {
      fwrite("ddb: Memory allocation failed\n",0x1e,1,_stderr);
      lVar6 = 0;
      if (ndims < 1) {
        ndims = lVar6;
      }
      for (; ndims != lVar6; lVar6 = lVar6 + 1) {
        pedims[lVar6] = 0;
      }
    }
    else {
      blk_00 = (Integer *)calloc(__nmemb,8);
      if (blk_00 == (Integer *)0x0) {
        fwrite("ddb: Memory allocation failed\n",0x1e,1,_stderr);
        lVar6 = 0;
        if (ndims < 1) {
          ndims = lVar6;
        }
        for (; ndims != lVar6; lVar6 = lVar6 + 1) {
          pedims[lVar6] = 0;
        }
      }
      else {
        pedims_00 = (Integer *)calloc(__nmemb,8);
        if (pedims_00 != (Integer *)0x0) {
          for (sVar4 = 0; __nmemb != sVar4; sVar4 = sVar4 + 1) {
            blk_00[sVar4] = 1;
          }
          lVar6 = 0;
          if (ndims < 1) {
            ndims = lVar6;
          }
          lVar5 = 0;
          for (; ndims != lVar6; lVar6 = lVar6 + 1) {
            if (pedims[lVar6] < 0) {
              ardims_00[lVar5] = ardims[lVar6];
              lVar5 = lVar5 + 1;
            }
          }
          ddb_h2(__nmemb,ardims_00,npes,0.1,0,blk_00,pedims_00);
          lVar6 = 0;
          for (lVar5 = 0; ndims != lVar5; lVar5 = lVar5 + 1) {
            if (pedims[lVar5] < 0) {
              blk[lVar5] = (ardims_00[lVar6] + pedims_00[lVar6] + -1) / pedims_00[lVar6];
              lVar6 = lVar6 + 1;
            }
          }
          lVar5 = 0;
          for (lVar6 = 0; ndims != lVar6; lVar6 = lVar6 + 1) {
            if (pedims[lVar6] < 0) {
              pIVar1 = pedims_00 + lVar5;
              lVar5 = lVar5 + 1;
              pedims[lVar6] = *pIVar1;
            }
          }
          free(pedims_00);
          free(blk_00);
          free(ardims_00);
          return;
        }
        fwrite("ddb: Memory allocation failed\n",0x1e,1,_stderr);
        lVar6 = 0;
        if (ndims < 1) {
          ndims = lVar6;
        }
        for (; ndims != lVar6; lVar6 = lVar6 + 1) {
          pedims[lVar6] = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void ddb(Integer ndims, Integer ardims[], Integer npes, Integer blk[],
         Integer pedims[])
{
    double ddb_threshold = 0.1;
    long ddb_bias = 0;
    long i, j;
    Integer count = 0;
    Integer *tardim, *tblk, *tpedim;
    long tp, sp;

    tp = (long)npes;

    /* count how many axes have <don't care> block values.*/
    for(i=ndims-1;i>=0;i--){
       if(blk[i]<=0){
          pedims[i] = -1;
          count += 1;
       } else {
          sp = (long)(ardims[i]+blk[i]-1)/blk[i];
          if(sp>tp) {
             sp = tp; tp = 1;
             pedims[i] = (Integer)sp;
          } else {
             for(j=sp;j<tp&&(tp%j!=0);j++);
             pedims[i] = (Integer)j;
             tp = tp / j;
          }
       }
    }

    if(count>0){
       tardim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tardim==NULL) {
         fprintf(stderr,"ddb: Memory allocation failed\n");
         for(i=0;i<ndims;i++) pedims[i] = 0;
         return;
       }
       tblk = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tblk==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }
       tpedim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tpedim==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }

       for(i=0;i<count;i++) tblk[i] = 1;
       for(i=0,j=0;j<ndims;j++) 
          if(pedims[j]<0) tardim[i++] = ardims[j];

       ddb_h2( count, tardim, (Integer)tp, ddb_threshold, ddb_bias, tblk, tpedim);
       /* ddb_h1( count, tardim, tp, ddb_threshold, tblk, tpedim); */

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0){
             blk[j] = (tardim[i]+tpedim[i]-1)/tpedim[i];
             i = i+1;
          }

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = tpedim[i++];

       free( tpedim ); 
       free( tblk ); 
       free( tardim ); 
    } else {
       for(j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = 1;
    }

}